

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O2

void pzgeom::TPZQuadraticLine::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  Fad<double> *local_a8;
  double local_a0;
  double dStack_98;
  Fad<double> *local_90;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  local_88;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *local_78;
  double local_70;
  double dStack_68;
  Fad<double> *local_60;
  Fad<double> *local_58;
  Fad<double> qsi;
  
  Fad<double>::Fad(&qsi,loc->fStore);
  local_a0 = 1.0;
  dStack_98 = 0.0;
  local_70 = 2.0;
  dStack_68 = 0.0;
  local_90 = &qsi;
  local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_a8;
  local_78 = &local_88;
  local_58 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                     *)&local_78);
  local_a0 = 1.0;
  dStack_98 = 0.0;
  local_70 = 2.0;
  dStack_68 = 0.0;
  local_90 = &qsi;
  local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_a8;
  local_78 = &local_88;
  local_58 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,1,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                     *)&local_78);
  local_a0 = 1.0;
  dStack_98 = 0.0;
  local_70 = 1.0;
  dStack_68 = 0.0;
  local_90 = &qsi;
  local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_a8;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_78;
  local_60 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,2,0);
  Fad<double>::operator=(pFVar1,&local_88);
  local_a0 = 0.5;
  dStack_98 = 0.0;
  local_a8 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)&local_a8)
  ;
  local_a0 = 0.5;
  dStack_98 = 0.0;
  local_a8 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,1);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)&local_a8);
  local_a0 = -2.0;
  dStack_98 = 0.0;
  local_90 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,2);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_a8);
  Fad<double>::~Fad(&qsi);
  return;
}

Assistant:

void TPZQuadraticLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = loc[0];
    
    phi(0,0)  = -qsi*(1.-qsi)/2.;
    phi(1,0)  = +qsi*(1.+qsi)/2.;
    phi(2,0)  = (1.-qsi)*(1.+qsi);
    
    dphi(0,0) = qsi-0.5;
    dphi(0,1) = qsi+0.5;
    dphi(0,2) = -2.*qsi;
}